

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
SetArrayRaw(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *values,SizeType count,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Ch *pCVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_local;
  SizeType count_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *values_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_local;
  
  this->flags_ = 4;
  if (count == 0) {
    (this->data_).s.str = (Ch *)0x0;
  }
  else {
    pCVar1 = (Ch *)MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                             (allocator,(ulong)count * 0x18);
    (this->data_).s.str = pCVar1;
    memcpy((this->data_).s.str,values,(ulong)count * 0x18);
  }
  (this->data_).o.capacity = count;
  (this->data_).s.length = count;
  return;
}

Assistant:

void SetArrayRaw(GenericValue* values, SizeType count, Allocator& allocator) {
        flags_ = kArrayFlag;
        if (count) {
            data_.a.elements = (GenericValue*)allocator.Malloc(count * sizeof(GenericValue));
            std::memcpy(data_.a.elements, values, count * sizeof(GenericValue));
        }
        else
            data_.a.elements = NULL;
        data_.a.size = data_.a.capacity = count;
    }